

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::BasicReporter::~BasicReporter(BasicReporter *this)

{
  BasicReporter *this_local;
  
  (this->super_SharedImpl<Catch::IReporter>).super_IReporter.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__BasicReporter_0029d4a8;
  std::vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>::
  ~vector(&this->m_sectionSpans);
  SpanInfo::~SpanInfo(&this->m_testSpan);
  SpanInfo::~SpanInfo(&this->m_groupSpan);
  SpanInfo::~SpanInfo(&this->m_testingSpan);
  ReporterConfig::~ReporterConfig(&this->m_config);
  SharedImpl<Catch::IReporter>::~SharedImpl(&this->super_SharedImpl<Catch::IReporter>);
  return;
}

Assistant:

BasicReporter::~BasicReporter() {}